

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  int iVar1;
  size_t dlen;
  uint local_10 [2];
  
  iVar1 = _libssh2_base64_decode(session,data,(size_t *)local_10,src,(ulong)src_len);
  if (datalen != (uint *)0x0) {
    *datalen = local_10[0];
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_base64_decode(LIBSSH2_SESSION *session, char **data,
                      unsigned int *datalen, const char *src,
                      unsigned int src_len)
{
    int rc;
    size_t dlen;

    rc = _libssh2_base64_decode(session, data, &dlen, src, src_len);

    if(datalen)
        *datalen = (unsigned int)dlen;

    return rc;
}